

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object_get___proto__(JSContext *ctx,JSValue this_val)

{
  int iVar1;
  JSValue JVar2;
  JSValue JVar3;
  JSContext *unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  JSValue ret;
  JSValue val;
  undefined8 local_68;
  undefined8 local_10;
  undefined8 local_8;
  
  JVar2.tag = (int64_t)ctx;
  JVar2.u = (JSValueUnion)val.tag;
  JVar2 = JS_ToObject((JSContext *)val.u.ptr,JVar2);
  local_10 = JVar2.u;
  local_8 = (JSContext *)JVar2.tag;
  iVar1 = JS_IsException(JVar2);
  if (iVar1 == 0) {
    JVar3 = JS_GetPrototype(unaff_retaddr,(JSValue)in_stack_00000008);
    local_68 = JVar3.u;
    local_8 = (JSContext *)JVar3.tag;
    JS_FreeValue(local_8,JVar2);
    local_10 = local_68;
  }
  JVar3.tag = (int64_t)local_8;
  JVar3.u.float64 = local_10;
  return JVar3;
}

Assistant:

static JSValue js_object_get___proto__(JSContext *ctx, JSValueConst this_val)
{
    JSValue val, ret;

    val = JS_ToObject(ctx, this_val);
    if (JS_IsException(val))
        return val;
    ret = JS_GetPrototype(ctx, val);
    JS_FreeValue(ctx, val);
    return ret;
}